

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O1

void __thiscall Variation::canonify(Variation *this,NamedDnaSequence *reference,bool rightmost)

{
  string *this_00;
  undefined8 *puVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  undefined8 *puVar5;
  runtime_error *this_01;
  size_t pos;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if (*(int *)(this + 0x60) == 0) {
    return;
  }
  if (*(int *)(this + 0x60) == 2) {
    if (rightmost) {
      uVar9 = *(ulong *)(this + 0x30);
      while (uVar9 < reference->length) {
        cVar2 = NamedDnaSequence::operator[](reference,*(size_t *)(this + 0x28));
        cVar3 = NamedDnaSequence::operator[](reference,*(size_t *)(this + 0x30));
        if (cVar2 != cVar3) break;
        uVar9 = *(long *)(this + 0x30) + 1;
        *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
        *(ulong *)(this + 0x30) = uVar9;
      }
    }
    else {
      lVar7 = *(long *)(this + 0x28);
      while (lVar7 != 0) {
        cVar2 = NamedDnaSequence::operator[](reference,lVar7 - 1);
        cVar3 = NamedDnaSequence::operator[](reference,*(long *)(this + 0x30) - 1);
        if (cVar2 != cVar3) break;
        lVar7 = *(long *)(this + 0x28) + -1;
        *(long *)(this + 0x28) = lVar7;
        *(long *)(this + 0x30) = *(long *)(this + 0x30) + -1;
      }
    }
  }
  if (*(int *)(this + 0x60) != 1) {
    return;
  }
  if (*(long *)(this + 0x48) == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"Variation::canonify is only applicable to insertions if sequence is known");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (string *)(this + 0x40);
  if (rightmost) {
    pos = *(size_t *)(this + 0x28);
    if (pos == reference->length) {
      bVar8 = true;
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        cVar2 = *(char *)(*(long *)(this + 0x40) + uVar9 % *(ulong *)(this + 0x30));
        cVar3 = NamedDnaSequence::operator[](reference,pos);
        if (cVar2 != cVar3) {
          iVar4 = (int)uVar9;
          goto LAB_0017cc81;
        }
        uVar9 = uVar9 + 1;
        pos = *(long *)(this + 0x28) + uVar9;
      } while (pos != reference->length);
      iVar4 = 1;
LAB_0017cc81:
      bVar8 = iVar4 == 0;
    }
    if (bVar8) {
      return;
    }
    *(ulong *)(this + 0x28) = *(long *)(this + 0x28) + uVar9;
    if (uVar9 % *(ulong *)(this + 0x30) == 0) {
      return;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
    uVar9 = 0xf;
    if (local_50 != local_40) {
      uVar9 = local_40[0];
    }
    if (uVar9 < (ulong)(local_68 + local_48)) {
      uVar9 = 0xf;
      if (local_70 != local_60) {
        uVar9 = local_60[0];
      }
      if ((ulong)(local_68 + local_48) <= uVar9) {
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
        goto LAB_0017cd40;
      }
    }
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  }
  else {
    uVar9 = *(ulong *)(this + 0x28);
    if (uVar9 == 0) {
      bVar8 = true;
      uVar6 = 0;
    }
    else {
      lVar7 = -1;
      uVar6 = 0;
      do {
        cVar2 = *(char *)(~(uVar6 % *(ulong *)(this + 0x30)) +
                         *(ulong *)(this + 0x30) + *(long *)(this + 0x40));
        cVar3 = NamedDnaSequence::operator[](reference,uVar9 + lVar7);
        if (cVar2 != cVar3) {
          iVar4 = (int)uVar6;
          goto LAB_0017cbcf;
        }
        uVar6 = uVar6 + 1;
        uVar9 = *(ulong *)(this + 0x28);
        lVar7 = lVar7 + -1;
      } while (uVar6 != uVar9);
      iVar4 = 1;
LAB_0017cbcf:
      bVar8 = iVar4 == 0;
    }
    if (bVar8) {
      return;
    }
    *(ulong *)(this + 0x28) = *(long *)(this + 0x28) - uVar6;
    if (uVar6 % *(ulong *)(this + 0x30) == 0) {
      return;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
    uVar9 = 0xf;
    if (local_50 != local_40) {
      uVar9 = local_40[0];
    }
    if (uVar9 < (ulong)(local_68 + local_48)) {
      uVar9 = 0xf;
      if (local_70 != local_60) {
        uVar9 = local_60[0];
      }
      if ((ulong)(local_68 + local_48) <= uVar9) {
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
        goto LAB_0017cd40;
      }
    }
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  }
LAB_0017cd40:
  local_90 = &local_80;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar5[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar5;
  }
  local_88 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=(this_00,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void Variation::canonify(const NamedDnaSequence* reference, bool rightmost) {
	if (type == NONE) return;
	if (type == DELETION) {
		assert(coord1 < coord2);
		assert(coord2 <= reference->size());
		if (rightmost) {
			while (coord2 < reference->size()) {
				if ((*reference)[coord1] != (*reference)[coord2]) break;
				coord1 += 1;
				coord2 += 1;
			}
		} else {
			while (coord1 > 0) {
				if ((*reference)[coord1-1] != (*reference)[coord2-1]) break;
				coord1 -= 1;
				coord2 -= 1;
			}
		}
	}
	if (type == INSERTION) {
		if (sequence.size() == 0) throw runtime_error("Variation::canonify is only applicable to insertions if sequence is known");
		assert(coord1 <= reference->size());
		assert(sequence.size() == coord2);
		if (rightmost) {
			// number of positions by which insertion can be shifted to the right
			int shift = 0;
			while (true) {
				if (coord1 + shift == reference->size()) break;
				if (sequence[shift % coord2] != (*reference)[coord1 + shift]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 += shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(j, sequence.size()-j) + sequence.substr(0, j);
		} else {
			// number of positions by which insertion can be shifted to the left
			int shift = 0;
			while (true) {
				if (coord1 - shift == 0) break;
				if (sequence[coord2 - 1 - (shift % coord2)] != (*reference)[coord1 - shift - 1]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 -= shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(sequence.size()-j, j) + sequence.substr(0, sequence.size()-j);
		}
	}
}